

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal_buf.h
# Opt level: O2

int __thiscall
cppcms::util::filterbuf<test_app::upperA,_16>::overflow(filterbuf<test_app::upperA,_16> *this,int c)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  
  sVar2 = write(this,c,in_RDX,in_RCX);
  if ((int)sVar2 == 0) {
    iVar1 = 0;
    if (c != -1) {
      **(undefined1 **)&this->field_0x28 = (char)c;
      *(long *)&this->field_0x28 = *(long *)&this->field_0x28 + 1;
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int overflow(int c)
		{
			if(write()!=0)
				return -1;
			if(c!=EOF) {
				*pptr()=c;
				pbump(1);
			}
			return 0;
		}